

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,array_type *a,
          array_format_info *fmt,comment_type *com,source_location *loc)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  floating_type f;
  basic_value<toml::type_config> *pbVar3;
  pointer pcVar4;
  integer_type i;
  pointer pbVar5;
  size_type sVar6;
  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  _Var7;
  boolean_type *b;
  string_format_info *psVar8;
  string_type *psVar9;
  integer_type *piVar10;
  floating_type *pfVar11;
  table_format_info *ptVar12;
  table_type *t;
  undefined8 *puVar13;
  array_format aVar14;
  array_format aVar15;
  ulong uVar16;
  basic_value<toml::type_config> *e;
  basic_value<toml::type_config> *this_00;
  pointer pbVar17;
  undefined1 local_190 [32];
  char local_170;
  source_location *local_118;
  integer_format_info *local_110;
  string_type local_108;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  string_type local_c8;
  source_location local_a8;
  
  aVar15 = fmt->fmt;
  this_00 = (a->
            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_118 = loc;
  if (aVar15 == default_format) {
    if ((((this->keys_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->keys_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
        (pbVar3 = (a->
                  super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish, this_00 != pbVar3)) &&
       ((com->comments).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (com->comments).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<toml::basic_value<toml::type_config>const*,std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,__gnu_cxx::__ops::_Iter_negate<toml::detail::serializer<toml::type_config>::operator()[abi:cxx11](std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>const&,toml::array_format_info_const&,toml::preserve_comments_const&,toml::source_location_const&)::_lambda(toml::basic_value<toml::type_config>const&)_1_>>
                        (this_00,pbVar3);
      this_00 = (a->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (_Var7._M_current == pbVar3) {
        aVar15 = array_of_tables;
        goto LAB_0038c57c;
      }
    }
    pbVar3 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 == pbVar3) {
      aVar15 = oneline;
    }
    else {
      uVar16 = 0;
      aVar15 = multiline;
      do {
        if ((this_00->comments_).comments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this_00->comments_).comments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto switchD_0038c30b_caseD_5;
        switch(this_00->type_) {
        case boolean:
          b = basic_value<toml::type_config>::as_boolean(this_00);
          local_110 = (integer_format_info *)basic_value<toml::type_config>::as_boolean_fmt(this_00)
          ;
          source_location::source_location((source_location *)local_190,&this_00->region_);
          operator()[abi_cxx11_
                    (&local_108,this,b,(boolean_format_info *)local_110,(source_location *)local_190
                    );
          goto LAB_0038c50d;
        case integer:
          piVar10 = basic_value<toml::type_config>::as_integer(this_00);
          i = *piVar10;
          local_110 = basic_value<toml::type_config>::as_integer_fmt(this_00);
          source_location::source_location((source_location *)local_190,&this_00->region_);
          operator()[abi_cxx11_(&local_108,this,i,local_110,(source_location *)local_190);
          goto LAB_0038c50d;
        case floating:
          pfVar11 = basic_value<toml::type_config>::as_floating(this_00);
          f = *pfVar11;
          local_110 = (integer_format_info *)
                      basic_value<toml::type_config>::as_floating_fmt(this_00);
          source_location::source_location((source_location *)local_190,&this_00->region_);
          operator()[abi_cxx11_
                    (&local_108,this,f,(floating_format_info *)local_110,
                     (source_location *)local_190);
LAB_0038c50d:
          uVar16 = uVar16 + local_108._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_190);
          break;
        case string:
          psVar8 = basic_value<toml::type_config>::as_string_fmt(this_00);
          if ((psVar8->fmt == multiline_basic) ||
             (psVar8 = basic_value<toml::type_config>::as_string_fmt(this_00),
             psVar8->fmt == multiline_literal)) goto switchD_0038c30b_caseD_5;
          psVar9 = basic_value<toml::type_config>::as_string_abi_cxx11_(this_00);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar4 = (psVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar4,pcVar4 + psVar9->_M_string_length);
          psVar8 = basic_value<toml::type_config>::as_string_fmt(this_00);
          source_location::source_location((source_location *)local_190,&this_00->region_);
          operator()(&local_108,this,&local_c8,psVar8,(source_location *)local_190);
          sVar6 = local_108._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location((source_location *)local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          uVar16 = uVar16 + sVar6 + 2;
          break;
        case offset_datetime:
        case local_datetime:
        case array:
        case table:
          goto switchD_0038c30b_caseD_5;
        case local_date:
          uVar16 = uVar16 + 10;
          break;
        default:
          if (this_00->type_ == local_time) {
            uVar16 = uVar16 + 0xf;
          }
        }
        if (0x3c < uVar16) goto switchD_0038c30b_caseD_5;
        uVar16 = uVar16 + 2;
        this_00 = this_00 + 1;
      } while (this_00 != pbVar3);
      aVar15 = oneline;
switchD_0038c30b_caseD_5:
      this_00 = (a->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
  }
LAB_0038c57c:
  aVar14 = multiline;
  if (this->force_inline_ == false) {
    aVar14 = aVar15;
  }
  if (aVar15 != array_of_tables) {
    aVar14 = aVar15;
  }
  pbVar3 = (a->
           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  aVar15 = oneline;
  if (aVar14 != array_of_tables) {
    aVar15 = aVar14;
  }
  if (this_00 != pbVar3) {
    aVar15 = aVar14;
  }
  if (aVar15 == oneline) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'[');
    pbVar17 = (a->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar17 != pbVar5) {
      pcVar1 = local_190 + 0x10;
      do {
        this->force_inline_ = true;
        operator()[abi_cxx11_((string_type *)local_190,this,pbVar17);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        local_190._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,", ","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != pbVar5);
      if ((a->
          super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (a->
          super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      }
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,']');
    this->force_inline_ = false;
  }
  else if (aVar15 == array_of_tables) {
    if ((this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(0xa0);
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"array of table must have its key. use format(key, v)","");
      source_location::source_location(&local_a8,local_118);
      *puVar13 = &PTR__serialization_error_004d0978;
      puVar13[1] = puVar13 + 3;
      if (local_e8 == &local_d8) {
        puVar13[3] = CONCAT71(uStack_d7,local_d8);
        puVar13[4] = uStack_d0;
      }
      else {
        puVar13[1] = local_e8;
        puVar13[3] = CONCAT71(uStack_d7,local_d8);
      }
      puVar13[2] = local_e0;
      local_e0 = 0;
      local_d8 = 0;
      paVar2 = &local_a8.file_name_.field_2;
      *(undefined4 *)(puVar13 + 0xb) = (undefined4)local_a8.last_offset_;
      *(undefined4 *)((long)puVar13 + 0x5c) = local_a8.last_offset_._4_4_;
      *(undefined4 *)(puVar13 + 0xc) = (undefined4)local_a8.length_;
      *(undefined4 *)((long)puVar13 + 100) = local_a8.length_._4_4_;
      *(undefined4 *)(puVar13 + 9) = (undefined4)local_a8.last_line_;
      *(undefined4 *)((long)puVar13 + 0x4c) = local_a8.last_line_._4_4_;
      *(undefined4 *)(puVar13 + 10) = (undefined4)local_a8.last_column_;
      *(undefined4 *)((long)puVar13 + 0x54) = local_a8.last_column_._4_4_;
      *(undefined4 *)(puVar13 + 7) = (undefined4)local_a8.first_column_;
      *(undefined4 *)((long)puVar13 + 0x3c) = local_a8.first_column_._4_4_;
      *(undefined4 *)(puVar13 + 8) = (undefined4)local_a8.first_offset_;
      *(undefined4 *)((long)puVar13 + 0x44) = local_a8.first_offset_._4_4_;
      puVar13[5] = local_a8._0_8_;
      puVar13[6] = local_a8.first_line_;
      puVar13[0xd] = puVar13 + 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.file_name_._M_dataplus._M_p == paVar2) {
        puVar13[0xf] = CONCAT71(local_a8.file_name_.field_2._M_allocated_capacity._1_7_,
                                local_a8.file_name_.field_2._M_local_buf[0]);
        puVar13[0x10] = local_a8.file_name_.field_2._8_8_;
      }
      else {
        puVar13[0xd] = local_a8.file_name_._M_dataplus._M_p;
        puVar13[0xf] = CONCAT71(local_a8.file_name_.field_2._M_allocated_capacity._1_7_,
                                local_a8.file_name_.field_2._M_local_buf[0]);
      }
      puVar13[0xe] = local_a8.file_name_._M_string_length;
      local_a8.file_name_._M_string_length = 0;
      local_a8.file_name_.field_2._M_local_buf[0] = '\0';
      puVar13[0x11] =
           local_a8.line_str_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      puVar13[0x12] =
           local_a8.line_str_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      puVar13[0x13] =
           local_a8.line_str_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8 = &local_d8;
      local_a8.file_name_._M_dataplus._M_p = (pointer)paVar2;
      __cxa_throw(puVar13,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    local_118 = (source_location *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_118;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (this_00 != pbVar3) {
      pcVar1 = local_190 + 0x10;
      do {
        ptVar12 = basic_value<toml::type_config>::as_table_fmt(this_00);
        this->current_indent_ = this->current_indent_ + ptVar12->name_indent;
        ptVar12 = basic_value<toml::type_config>::as_table_fmt(this_00);
        format_comments_abi_cxx11_
                  ((string_type *)local_190,this,&this_00->comments_,ptVar12->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        ptVar12 = basic_value<toml::type_config>::as_table_fmt(this_00);
        format_indent_abi_cxx11_((string_type *)local_190,this,ptVar12->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        ptVar12 = basic_value<toml::type_config>::as_table_fmt(this_00);
        this->current_indent_ = this->current_indent_ - ptVar12->name_indent;
        local_190._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"[[","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        format_keys((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_190,this,&this->keys_);
        if (local_170 == '\0') {
          std::__throw_bad_optional_access();
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((local_170 == '\x01') && (local_170 = '\0', (char *)local_190._0_8_ != pcVar1)) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        local_190._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"]]\n","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        t = basic_value<toml::type_config>::as_table_abi_cxx11_(this_00);
        ptVar12 = basic_value<toml::type_config>::as_table_fmt(this_00);
        format_ml_table((string_type *)local_190,this,t,ptVar12);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pbVar3);
    }
  }
  else {
    local_118 = (source_location *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_118;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    pcVar1 = local_190 + 0x10;
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"[\n","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
    if ((char *)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    pbVar17 = (a->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (a->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar17 != pbVar5) {
      do {
        this->current_indent_ = this->current_indent_ + fmt->body_indent;
        format_comments_abi_cxx11_
                  ((string_type *)local_190,this,&pbVar17->comments_,fmt->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        format_indent_abi_cxx11_((string_type *)local_190,this,fmt->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        this->current_indent_ = this->current_indent_ - fmt->body_indent;
        this->force_inline_ = true;
        operator()[abi_cxx11_((string_type *)local_190,this,pbVar17);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        local_190._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,",\n","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
        if ((char *)local_190._0_8_ != pcVar1) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != pbVar5);
    }
    this->force_inline_ = false;
    this->current_indent_ = this->current_indent_ + fmt->closing_indent;
    format_indent_abi_cxx11_((string_type *)local_190,this,fmt->indent_type);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(char *)local_190._0_8_,local_190._8_8_);
    if ((char *)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    this->current_indent_ = this->current_indent_ - fmt->closing_indent;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,']');
  }
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const array_type& a, const array_format_info& fmt, const comment_type& com, const source_location& loc) // {{{
    {
        array_format f = fmt.fmt;
        if(fmt.fmt == array_format::default_format)
        {
            // [[in.this.form]], you cannot add a comment to the array itself
            // (but you can add a comment to each table).
            // To keep comments, we need to avoid multiline array-of-tables
            // if array itself has a comment.
            if( ! this->keys_.empty() &&
                ! a.empty() &&
                com.empty() &&
                std::all_of(a.begin(), a.end(), [](const value_type& e) {return e.is_table();}))
            {
                f = array_format::array_of_tables;
            }
            else
            {
                f = array_format::oneline;

                // check if it becomes long
                std::size_t approx_len = 0;
                for(const auto& e : a)
                {
                    // have a comment. cannot be inlined
                    if( ! e.comments().empty())
                    {
                        f = array_format::multiline;
                        break;
                    }
                    // possibly long types ...
                    if(e.is_array() || e.is_table() || e.is_offset_datetime() || e.is_local_datetime())
                    {
                        f = array_format::multiline;
                        break;
                    }
                    else if(e.is_boolean())
                    {
                        approx_len += (*this)(e.as_boolean(), e.as_boolean_fmt(), e.location()).size();
                    }
                    else if(e.is_integer())
                    {
                        approx_len += (*this)(e.as_integer(), e.as_integer_fmt(), e.location()).size();
                    }
                    else if(e.is_floating())
                    {
                        approx_len += (*this)(e.as_floating(), e.as_floating_fmt(), e.location()).size();
                    }
                    else if(e.is_string())
                    {
                        if(e.as_string_fmt().fmt == string_format::multiline_basic ||
                           e.as_string_fmt().fmt == string_format::multiline_literal)
                        {
                            f = array_format::multiline;
                            break;
                        }
                        approx_len += 2 + (*this)(e.as_string(), e.as_string_fmt(), e.location()).size();
                    }
                    else if(e.is_local_date())
                    {
                        approx_len += 10; // 1234-56-78
                    }
                    else if(e.is_local_time())
                    {
                        approx_len += 15; // 12:34:56.789012
                    }

                    if(approx_len > 60) // key, ` = `, `[...]` < 80
                    {
                        f = array_format::multiline;
                        break;
                    }
                    approx_len += 2; // `, `
                }
            }
        }
        if(this->force_inline_ && f == array_format::array_of_tables)
        {
            f = array_format::multiline;
        }
        if(a.empty() && f == array_format::array_of_tables)
        {
            f = array_format::oneline;
        }

        // --------------------------------------------------------------------

        if(f == array_format::array_of_tables)
        {
            if(this->keys_.empty())
            {
                throw serialization_error("array of table must have its key. "
                        "use format(key, v)", loc);
            }
            string_type retval;
            for(const auto& e : a)
            {
                assert(e.is_table());

                this->current_indent_ += e.as_table_fmt().name_indent;
                retval += this->format_comments(e.comments(), e.as_table_fmt().indent_type);
                retval += this->format_indent(e.as_table_fmt().indent_type);
                this->current_indent_ -= e.as_table_fmt().name_indent;

                retval += string_conv<string_type>("[[");
                retval += this->format_keys(this->keys_).value();
                retval += string_conv<string_type>("]]\n");

                retval += this->format_ml_table(e.as_table(), e.as_table_fmt());
            }
            return retval;
        }
        else if(f == array_format::oneline)
        {
            // ignore comments. we cannot emit comments
            string_type retval;
            retval += char_type('[');
            for(const auto& e : a)
            {
                this->force_inline_ = true;
                retval += (*this)(e);
                retval += string_conv<string_type>(", ");
            }
            if( ! a.empty())
            {
                retval.pop_back(); // ` `
                retval.pop_back(); // `,`
            }
            retval += char_type(']');
            this->force_inline_ = false;
            return retval;
        }
        else
        {
            assert(f == array_format::multiline);

            string_type retval;
            retval += string_conv<string_type>("[\n");

            for(const auto& e : a)
            {
                this->current_indent_ += fmt.body_indent;
                retval += this->format_comments(e.comments(), fmt.indent_type);
                retval += this->format_indent(fmt.indent_type);
                this->current_indent_ -= fmt.body_indent;

                this->force_inline_ = true;
                retval += (*this)(e);
                retval += string_conv<string_type>(",\n");
            }
            this->force_inline_ = false;

            this->current_indent_ += fmt.closing_indent;
            retval += this->format_indent(fmt.indent_type);
            this->current_indent_ -= fmt.closing_indent;

            retval += char_type(']');
            return retval;
        }
    }